

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backend_sdl.cpp
# Opt level: O2

void __thiscall
CCommandProcessorFragment_OpenGL::Cmd_Texture_Create
          (CCommandProcessorFragment_OpenGL *this,CTextureCreateCommand *pCommand)

{
  int *piVar1;
  undefined4 uVar2;
  int iVar3;
  uchar *puVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  undefined8 uVar11;
  uint NewWidth;
  uint uVar12;
  uint uVar13;
  uchar *dest;
  uchar *puVar14;
  undefined8 uVar15;
  int TexWidth;
  uint Height;
  int iVar16;
  uchar *source;
  int iVar17;
  uchar *pData;
  long lVar18;
  bool bVar19;
  float fVar20;
  int local_94;
  
  uVar12 = pCommand->m_Width;
  Height = pCommand->m_Height;
  pData = (uchar *)pCommand->m_pData;
  iVar16 = pCommand->m_Format;
  if (1 < iVar16 - 1U) goto LAB_001156cd;
  iVar3 = this->m_MaxTexSize;
  uVar10 = pCommand->m_Flags;
  iVar7 = iVar3;
  if (((((uVar10 & 8) != 0) && (0x3f < this->m_Max3DTexSize)) &&
      (iVar9 = this->m_Max3DTexSize * 0x10, iVar7 = iVar9, (uVar10 & 0x10) != 0)) &&
     (iVar7 = iVar3, iVar9 <= iVar3)) {
    iVar7 = iVar9;
  }
  uVar13 = Height;
  NewWidth = uVar12;
  if (iVar7 < (int)Height || iVar7 < (int)uVar12) {
    do {
      NewWidth = (int)NewWidth >> 1;
      uVar13 = (int)uVar13 >> 1;
    } while (iVar7 < (int)uVar13 || iVar7 < (int)NewWidth);
LAB_00115628:
    puVar4 = (uchar *)Rescale(uVar12,Height,NewWidth,uVar13,iVar16,pData);
    mem_free(pData);
    pData = puVar4;
    uVar12 = NewWidth;
    Height = uVar13;
  }
  else if ((char)((uVar10 & 4) >> 2) == '\0' && (0x10 < (int)Height && 0x10 < (int)uVar12)) {
    NewWidth = uVar12 >> 1;
    uVar13 = Height >> 1;
    goto LAB_00115628;
  }
  iVar16 = pCommand->m_Format;
  if (iVar16 == 2) {
    uVar8 = 0;
    uVar5 = (ulong)(uVar12 * Height);
    if ((int)(uVar12 * Height) < 1) {
      uVar5 = uVar8;
    }
    for (; uVar5 != uVar8; uVar8 = uVar8 + 1) {
      fVar20 = (float)pData[uVar8 * 4 + 3] / 255.0;
      pData[uVar8 * 4] = (uchar)(int)((float)pData[uVar8 * 4] * fVar20);
      pData[uVar8 * 4 + 1] = (uchar)(int)((float)pData[uVar8 * 4 + 1] * fVar20);
      pData[uVar8 * 4 + 2] = (uchar)(int)((float)pData[uVar8 * 4 + 2] * fVar20);
    }
    iVar16 = pCommand->m_Format;
  }
LAB_001156cd:
  iVar3 = pCommand->m_Slot;
  this->m_aTextures[iVar3].m_Format = iVar16;
  local_94 = 0x1908;
  uVar2 = 0x1908;
  if (iVar16 - 1U < 3) {
    uVar2 = *(undefined4 *)(&DAT_001c4098 + (ulong)(iVar16 - 1U) * 4);
  }
  uVar10 = pCommand->m_StoreFormat - 1;
  if (uVar10 < 3) {
    local_94 = *(int *)(&DAT_001c4098 + (ulong)uVar10 * 4);
  }
  uVar10 = pCommand->m_Flags;
  if ((uVar10 & 2) != 0) {
    local_94 = *(int *)((long)local_94 * 4 + 0x1bdc8c);
  }
  if ((uVar10 & 0x10) != 0) {
    glGenTextures(1,this->m_aTextures + iVar3);
    iVar16 = pCommand->m_Slot;
    piVar1 = &this->m_aTextures[iVar16].m_State;
    *piVar1 = *piVar1 | 1;
    glBindTexture(0xde1,this->m_aTextures[iVar16].m_Tex2D);
    glTexParameteri(0xde1,0x2800,0x2601);
    if ((uVar10 & 1) == 0) {
      glTexParameteri(0xde1,0x2801,(uint)((pCommand->m_Flags & 0x20) == 0) << 8 | 0x2601);
      uVar11 = 1;
      uVar15 = 0x8191;
    }
    else {
      uVar15 = 0x2801;
      uVar11 = 0x2601;
    }
    glTexParameteri(0xde1,uVar15,uVar11);
    glTexImage2D(0xde1,0,local_94,uVar12,Height,0,uVar2,0x1401,pData);
    iVar16 = pCommand->m_PixelSize;
    iVar7 = Height * uVar12 * iVar16;
    iVar3 = pCommand->m_Slot;
    this->m_aTextures[iVar3].m_MemSize = iVar7;
    if ((uVar10 & 1) == 0) {
      uVar10 = Height;
      uVar13 = uVar12;
      while ((2 < (int)uVar13 && (2 < (int)uVar10))) {
        uVar13 = uVar13 >> 1;
        uVar10 = uVar10 >> 1;
        iVar7 = iVar7 + uVar10 * iVar16 * uVar13;
        this->m_aTextures[iVar3].m_MemSize = iVar7;
      }
    }
  }
  puVar4 = pData;
  if (((pCommand->m_Flags & 8) != 0) && (uVar10 = this->m_Max3DTexSize, 0x3f < (int)uVar10)) {
    iVar17 = (int)uVar12 / 0x10;
    iVar7 = (int)((long)(int)Height / 0x10);
    iVar9 = iVar7 * iVar17;
    uVar12 = pCommand->m_PixelSize * iVar9 * 0x100;
    puVar4 = (uchar *)mem_alloc(uVar12);
    iVar16 = pCommand->m_PixelSize;
    uVar13 = iVar16 * iVar17;
    mem_zero(puVar4,uVar12);
    uVar12 = 0;
    uVar5 = 0;
    if (0 < iVar7) {
      uVar5 = (long)(int)Height / 0x10 & 0xffffffff;
    }
    puVar14 = puVar4;
    for (lVar6 = 0; lVar6 != 0x100; lVar6 = lVar6 + 1) {
      source = pData + (int)(pCommand->m_PixelSize * iVar17 *
                            ((uVar12 & 0xf) + (uVar12 >> 4) * iVar7 * 0x10));
      dest = puVar14;
      uVar8 = uVar5;
      while (bVar19 = uVar8 != 0, uVar8 = uVar8 - 1, bVar19) {
        mem_copy(dest,source,uVar13);
        dest = dest + (int)uVar13;
        source = source + (int)(uVar13 * 0x10);
      }
      puVar14 = puVar14 + iVar16 * iVar9;
      uVar12 = uVar12 + 1;
    }
    uVar12 = 0x100;
    if (uVar10 < 0x100) {
      uVar12 = uVar10;
    }
    mem_free(pData);
    glGenTextures(this->m_TextureArraySize,this->m_aTextures[pCommand->m_Slot].m_Tex3D);
    lVar6 = (long)pCommand->m_Slot;
    piVar1 = &this->m_aTextures[lVar6].m_State;
    *piVar1 = *piVar1 | 2;
    iVar16 = 0;
    for (lVar18 = 0; iVar3 = (int)lVar6, lVar18 < this->m_TextureArraySize; lVar18 = lVar18 + 1) {
      glBindTexture(0x806f,this->m_aTextures[iVar3].m_Tex3D[lVar18]);
      glTexParameteri(0x806f,0x2800,0x2601);
      glTexParameteri(0x806f,0x2801,0x2601);
      glTexImage3D(0x806f,0,local_94,iVar17,iVar7,uVar12,0,uVar2,0x1401,
                   puVar4 + pCommand->m_PixelSize * iVar16);
      lVar6 = (long)pCommand->m_Slot;
      piVar1 = &this->m_aTextures[lVar6].m_MemSize;
      *piVar1 = *piVar1 + pCommand->m_PixelSize * iVar9;
      iVar16 = iVar16 + iVar9 * uVar12;
    }
  }
  *this->m_pTextureMemoryUsage = *this->m_pTextureMemoryUsage + this->m_aTextures[iVar3].m_MemSize;
  mem_free(puVar4);
  return;
}

Assistant:

void CCommandProcessorFragment_OpenGL::Cmd_Texture_Create(const CCommandBuffer::CTextureCreateCommand *pCommand)
{
	int Width = pCommand->m_Width;
	int Height = pCommand->m_Height;
	void *pTexData = pCommand->m_pData;

	// resample if needed
	if(pCommand->m_Format == CCommandBuffer::TEXFORMAT_RGBA || pCommand->m_Format == CCommandBuffer::TEXFORMAT_RGB)
	{
		int MaxTexSize = m_MaxTexSize;
		if((pCommand->m_Flags&CCommandBuffer::TEXFLAG_TEXTURE3D) && m_Max3DTexSize >= CTexture::MIN_GL_MAX_3D_TEXTURE_SIZE)
		{
			if(pCommand->m_Flags&CCommandBuffer::TEXFLAG_TEXTURE2D)
				MaxTexSize = minimum(MaxTexSize, m_Max3DTexSize * IGraphics::NUMTILES_DIMENSION);
			else
				MaxTexSize = m_Max3DTexSize * IGraphics::NUMTILES_DIMENSION;
		}
		if(Width > MaxTexSize || Height > MaxTexSize)
		{
			do
			{
				Width>>=1;
				Height>>=1;
			}
			while(Width > MaxTexSize || Height > MaxTexSize);

			void *pTmpData = Rescale(pCommand->m_Width, pCommand->m_Height, Width, Height, pCommand->m_Format, static_cast<const unsigned char *>(pCommand->m_pData));
			mem_free(pTexData);
			pTexData = pTmpData;
		}
		else if(Width > IGraphics::NUMTILES_DIMENSION && Height > IGraphics::NUMTILES_DIMENSION && (pCommand->m_Flags&CCommandBuffer::TEXFLAG_QUALITY) == 0)
		{
			Width>>=1;
			Height>>=1;

			void *pTmpData = Rescale(pCommand->m_Width, pCommand->m_Height, Width, Height, pCommand->m_Format, static_cast<const unsigned char *>(pCommand->m_pData));
			mem_free(pTexData);
			pTexData = pTmpData;
		}
	}

	// use premultiplied alpha for rgba textures
	if(pCommand->m_Format == CCommandBuffer::TEXFORMAT_RGBA)
	{
		unsigned char *pTexels = (unsigned char *)pTexData;
		for(int i = 0; i < Width * Height; ++i)
		{
			const float a = (pTexels[i*4+3]/255.0f);
			pTexels[i*4+0] = (unsigned char)(pTexels[i*4+0] * a);
			pTexels[i*4+1] = (unsigned char)(pTexels[i*4+1] * a);
			pTexels[i*4+2] = (unsigned char)(pTexels[i*4+2] * a);
		}
	}
	m_aTextures[pCommand->m_Slot].m_Format = pCommand->m_Format;

	//
	int Oglformat = TexFormatToOpenGLFormat(pCommand->m_Format);
	int StoreOglformat = TexFormatToOpenGLFormat(pCommand->m_StoreFormat);

	if(pCommand->m_Flags&CCommandBuffer::TEXFLAG_COMPRESSED)
	{
		switch(StoreOglformat)
		{
			case GL_RGB: StoreOglformat = GL_COMPRESSED_RGB_ARB; break;
			case GL_ALPHA: StoreOglformat = GL_COMPRESSED_ALPHA_ARB; break;
			case GL_RGBA: StoreOglformat = GL_COMPRESSED_RGBA_ARB; break;
			default: StoreOglformat = GL_COMPRESSED_RGBA_ARB;
		}
	}

	// 2D texture
	if(pCommand->m_Flags&CCommandBuffer::TEXFLAG_TEXTURE2D)
	{
		bool Mipmaps = !(pCommand->m_Flags&CCommandBuffer::TEXFLAG_NOMIPMAPS);
		glGenTextures(1, &m_aTextures[pCommand->m_Slot].m_Tex2D);
		m_aTextures[pCommand->m_Slot].m_State |= CTexture::STATE_TEX2D;
		glBindTexture(GL_TEXTURE_2D, m_aTextures[pCommand->m_Slot].m_Tex2D);
		if(!Mipmaps)
		{
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
			glTexImage2D(GL_TEXTURE_2D, 0, StoreOglformat, Width, Height, 0, Oglformat, GL_UNSIGNED_BYTE, pTexData);
		}
		else
		{
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
			if(pCommand->m_Flags&CCommandBuffer::TEXTFLAG_LINEARMIPMAPS)
				glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
			else
				glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR_MIPMAP_NEAREST);
			glTexParameteri(GL_TEXTURE_2D, GL_GENERATE_MIPMAP, GL_TRUE);
			glTexImage2D(GL_TEXTURE_2D, 0, StoreOglformat, Width, Height, 0, Oglformat, GL_UNSIGNED_BYTE, pTexData);
		}

		// calculate memory usage
		m_aTextures[pCommand->m_Slot].m_MemSize = Width*Height*pCommand->m_PixelSize;
		if(Mipmaps)
		{
			int TexWidth = Width;
			int TexHeight = Height;
			while(TexWidth > 2 && TexHeight > 2)
			{
				TexWidth>>=1;
				TexHeight>>=1;
				m_aTextures[pCommand->m_Slot].m_MemSize += TexWidth*TexHeight*pCommand->m_PixelSize;
			}
		}
	}

	// 3D texture
	if((pCommand->m_Flags&CCommandBuffer::TEXFLAG_TEXTURE3D) && m_Max3DTexSize >= CTexture::MIN_GL_MAX_3D_TEXTURE_SIZE)
	{
		Width /= IGraphics::NUMTILES_DIMENSION;
		Height /= IGraphics::NUMTILES_DIMENSION;
		int Depth = minimum(m_Max3DTexSize, IGraphics::NUMTILES_DIMENSION * IGraphics::NUMTILES_DIMENSION);

		// copy and reorder texture data
		int MemSize = Width*Height*IGraphics::NUMTILES_DIMENSION*IGraphics::NUMTILES_DIMENSION*pCommand->m_PixelSize;
		char *pTmpData = (char *)mem_alloc(MemSize);

		const int TileSize = (Height * Width) * pCommand->m_PixelSize;
		const int TileRowSize = Width * pCommand->m_PixelSize;
		const int ImagePitch = Width * IGraphics::NUMTILES_DIMENSION * pCommand->m_PixelSize;
		mem_zero(pTmpData, MemSize);
		for(int i = 0; i < IGraphics::NUMTILES_DIMENSION * IGraphics::NUMTILES_DIMENSION; i++)
		{
			const int px = (i%IGraphics::NUMTILES_DIMENSION) * Width;
			const int py = (i/IGraphics::NUMTILES_DIMENSION) * Height;
			const char *pTileData = (const char *)pTexData + (py * Width * IGraphics::NUMTILES_DIMENSION + px) * pCommand->m_PixelSize;
			for(int y = 0; y < Height; y++)
				mem_copy(pTmpData + i*TileSize + y*TileRowSize, pTileData + y * ImagePitch, TileRowSize);
		}

		mem_free(pTexData);

		//
		glGenTextures(m_TextureArraySize, m_aTextures[pCommand->m_Slot].m_Tex3D);
		m_aTextures[pCommand->m_Slot].m_State |= CTexture::STATE_TEX3D;
		for(int i = 0; i < m_TextureArraySize; ++i)
		{
			glBindTexture(GL_TEXTURE_3D, m_aTextures[pCommand->m_Slot].m_Tex3D[i]);
			glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
			glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
			pTexData = pTmpData+i*(Width*Height*Depth*pCommand->m_PixelSize);
			glTexImage3D(GL_TEXTURE_3D, 0, StoreOglformat, Width, Height, Depth, 0, Oglformat, GL_UNSIGNED_BYTE, pTexData);

			m_aTextures[pCommand->m_Slot].m_MemSize += Width*Height*pCommand->m_PixelSize;
		}
		pTexData = pTmpData;
	}

	*m_pTextureMemoryUsage += m_aTextures[pCommand->m_Slot].m_MemSize;

	mem_free(pTexData);
}